

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VirtualIterator.hpp
# Opt level: O3

VirtualIterator<Indexing::TermWithValue<Kernel::Literal_*>_*>
Lib::VirtualIterator<Indexing::TermWithValue<Kernel::Literal_*>_*>::getEmpty(void)

{
  int *piVar1;
  VirtualIterator<Indexing::TermWithValue<Kernel::Literal_*>_*> VVar2;
  int iVar3;
  IteratorCore<Indexing::TermWithValue<Kernel::Literal_*>_*> *in_RDI;
  
  if (VirtualIterator<Indexing::TermWithValue<Kernel::Literal*>*>::getEmpty()::inst == '\0') {
    iVar3 = __cxa_guard_acquire(&VirtualIterator<Indexing::TermWithValue<Kernel::Literal*>*>::
                                 getEmpty()::inst);
    if (iVar3 != 0) {
      getEmpty::inst._core =
           (IteratorCore<Indexing::TermWithValue<Kernel::Literal_*>_*> *)
           FixedSizeAllocator<16UL>::alloc
                     ((FixedSizeAllocator<16UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18));
      (getEmpty::inst._core)->_vptr_IteratorCore = (_func_int **)&PTR__IteratorCore_00b344d0;
      (getEmpty::inst._core)->_refCnt = 1;
      __cxa_atexit(~VirtualIterator,&getEmpty::inst,&__dso_handle);
      __cxa_guard_release(&VirtualIterator<Indexing::TermWithValue<Kernel::Literal*>*>::getEmpty()::
                           inst);
    }
  }
  VVar2._core = getEmpty::inst._core;
  in_RDI->_vptr_IteratorCore = (_func_int **)getEmpty::inst._core;
  if (VVar2._core != (IteratorCore<Indexing::TermWithValue<Kernel::Literal_*>_*> *)0x0) {
    piVar1 = &(VVar2._core)->_refCnt;
    *piVar1 = *piVar1 + 1;
  }
  return (VirtualIterator<Indexing::TermWithValue<Kernel::Literal_*>_*>)in_RDI;
}

Assistant:

static VirtualIterator getEmpty()
  {
    static VirtualIterator inst(new EmptyIterator<T>());
    return inst;
  }